

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.h
# Opt level: O3

void __thiscall FIX::MemoryStore::MemoryStore(MemoryStore *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 local_20;
  int64_t iStack_18;
  
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__MemoryStore_001eb7c0;
  p_Var1 = &(this->m_messages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_nextSenderMsgSeqNum = 1;
  this->m_nextTargetMsgSeqNum = 1;
  DateTime::nowUtc();
  *(undefined8 *)&(this->m_creationTime).super_DateTime.m_date = local_20;
  (this->m_creationTime).super_DateTime.m_time = iStack_18;
  (this->m_creationTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001ea8f0;
  return;
}

Assistant:

MemoryStore() : m_nextSenderMsgSeqNum( 1 ), m_nextTargetMsgSeqNum( 1 ) {}